

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall
Plan::AddSubTarget(Plan *this,Node *node,Node *dependent,string *err,
                  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *dyndep_walk)

{
  Edge *this_00;
  bool bVar1;
  iterator want_e;
  long *plVar2;
  long *plVar3;
  Node **ppNVar4;
  size_type *psVar5;
  bool bVar6;
  uint uVar7;
  pointer ppNVar9;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>,_bool> pVar10;
  Edge *edge;
  string referenced;
  Edge *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  pair<Edge_*,_Plan::Want> local_90;
  undefined1 local_80;
  undefined7 uStack_7f;
  Node **local_70;
  pointer local_68;
  Node *local_60;
  pointer ppNStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ulong uVar8;
  
  this_00 = node->in_edge_;
  local_d8 = this_00;
  if (this_00 == (Edge *)0x0) {
    if (node->dirty_ != true) {
      return false;
    }
    local_90.second = kWantNothing;
    local_90._12_4_ = 0;
    local_80 = 0;
    local_90.first = (Edge *)&local_80;
    if (dependent != (Node *)0x0) {
      std::operator+(&local_d0,", needed by \'",&dependent->path_);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_a0 = *plVar3;
        lStack_98 = plVar2[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar3;
        local_b0 = (long *)*plVar2;
      }
      local_a8 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+(&local_50,"\'",&node->path_);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    ppNVar4 = (Node **)(plVar2 + 2);
    if ((Node **)*plVar2 == ppNVar4) {
      local_60 = *ppNVar4;
      ppNStack_58 = (pointer)plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *ppNVar4;
      local_70 = (Node **)*plVar2;
    }
    local_68 = (pointer)plVar2[1];
    *plVar2 = (long)ppNVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90.first);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar2[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,(ulong)((long)&(local_60->path_)._M_dataplus._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,(ulong)(local_50.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_90.first == (Edge *)&local_80) {
      return false;
    }
    operator_delete(local_90.first,CONCAT71(uStack_7f,local_80) + 1);
    return false;
  }
  if (this_00->outputs_ready_ != false) {
    return false;
  }
  local_90._8_8_ = local_90._8_8_ & 0xffffffff00000000;
  local_90.first = this_00;
  pVar10 = std::
           _Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
           ::_M_emplace_unique<std::pair<Edge*,Plan::Want>>
                     ((_Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                       *)this,&local_90);
  uVar8 = pVar10._8_8_;
  uVar7 = pVar10._8_4_;
  want_e._M_node = (_Base_ptr)pVar10.first._M_node;
  if ((dyndep_walk != (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) &&
     (*(int *)&want_e._M_node[1]._M_parent == 2)) {
    return false;
  }
  if ((node->dirty_ == true) && (*(int *)&want_e._M_node[1]._M_parent == 0)) {
    bVar6 = pVar10.second;
    *(undefined4 *)&want_e._M_node[1]._M_parent = 1;
    this->wanted_edges_ = this->wanted_edges_ + 1;
    bVar1 = Edge::is_phony(this_00);
    if (!bVar1) {
      this->command_edges_ = this->command_edges_ + 1;
    }
    uVar7 = (uint)bVar6;
    if (dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0) {
      bVar1 = Edge::AllInputsReady(this_00);
      uVar8 = (ulong)bVar6;
      if (bVar1) {
        ScheduleWork(this,want_e);
        uVar8 = (ulong)bVar6;
      }
      goto LAB_00108050;
    }
  }
  else if (dyndep_walk == (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0)
  goto LAB_00108050;
  uVar8 = (ulong)uVar7;
  std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
  _M_insert_unique<Edge*const&>
            ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>> *)
             dyndep_walk,&local_d8);
LAB_00108050:
  if ((uVar8 & 1) == 0) {
    return true;
  }
  ppNVar9 = (local_d8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppNVar9 ==
        (local_d8->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return true;
    }
    bVar1 = AddSubTarget(this,*ppNVar9,node,err,dyndep_walk);
    if ((!bVar1) && (err->_M_string_length != 0)) break;
    ppNVar9 = ppNVar9 + 1;
  }
  return false;
}

Assistant:

bool Plan::AddSubTarget(const Node* node, const Node* dependent, string* err,
                        set<Edge*>* dyndep_walk) {
  Edge* edge = node->in_edge();
  if (!edge) {  // Leaf node.
    if (node->dirty()) {
      string referenced;
      if (dependent)
        referenced = ", needed by '" + dependent->path() + "',";
      *err = "'" + node->path() + "'" + referenced + " missing "
             "and no known rule to make it";
    }
    return false;
  }

  if (edge->outputs_ready())
    return false;  // Don't need to do anything.

  // If an entry in want_ does not already exist for edge, create an entry which
  // maps to kWantNothing, indicating that we do not want to build this entry itself.
  pair<map<Edge*, Want>::iterator, bool> want_ins =
    want_.insert(make_pair(edge, kWantNothing));
  Want& want = want_ins.first->second;

  if (dyndep_walk && want == kWantToFinish)
    return false;  // Don't need to do anything with already-scheduled edge.

  // If we do need to build edge and we haven't already marked it as wanted,
  // mark it now.
  if (node->dirty() && want == kWantNothing) {
    want = kWantToStart;
    EdgeWanted(edge);
    if (!dyndep_walk && edge->AllInputsReady())
      ScheduleWork(want_ins.first);
  }

  if (dyndep_walk)
    dyndep_walk->insert(edge);

  if (!want_ins.second)
    return true;  // We've already processed the inputs.

  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    if (!AddSubTarget(*i, node, err, dyndep_walk) && !err->empty())
      return false;
  }

  return true;
}